

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O0

bool __thiscall configFileReader::isEOF(configFileReader *this)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  typeOfSeparator tVar4;
  ulong uVar5;
  bool bVar6;
  int local_20;
  int local_1c;
  int i;
  int count;
  configFileReader *this_local;
  
  if ((this->readFromString & 1U) == 0) {
    openFile(this);
    iVar3 = std::ios::rdstate();
    if ((iVar3 == 0) && (iVar3 = std::ios::rdstate(), iVar3 == 0)) {
      local_1c = 0;
      do {
        iVar3 = std::ios::rdstate();
        bVar6 = false;
        if (iVar3 == 0) {
          iVar3 = std::ios::rdstate();
          bVar6 = false;
          if (iVar3 == 0) {
            cVar2 = peekNextChar(this);
            tVar4 = isSeparator(this,cVar2);
            bVar6 = tVar4 == space;
          }
        }
        if (!bVar6) {
          cVar2 = peekNextChar(this);
          if (cVar2 != -1) {
            return false;
          }
          return true;
        }
        skipNextChar(this);
        local_1c = local_1c + 1;
        cVar2 = peekNextChar(this);
        tVar4 = isSeparator(this,cVar2);
      } while ((tVar4 == space) || (cVar2 = peekNextChar(this), cVar2 == -1));
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        std::istream::unget();
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    uVar1 = this->index;
    uVar5 = std::__cxx11::string::length();
    this_local._7_1_ = uVar5 <= uVar1;
  }
  return this_local._7_1_;
}

Assistant:

bool configFileReader::isEOF() {
    if (readFromString) {
        return index >= text.length();
    } else {
        openFile();
        if ((configFile->rdstate() && ios::eofbit) || (configFile->rdstate() && ios::failbit)) {
            return true;
        }
        int count = 0;
        while (!(configFile->rdstate() && ios::eofbit) && !(configFile->rdstate() && ios::failbit) &&
               isSeparator(peekNextChar()) == typeOfSeparator::space) {
            skipNextChar();
            count++;
            if (isSeparator(peekNextChar()) != typeOfSeparator::space && peekNextChar() != -1) {
                for (int i = 0; i < count; i++) {
                    configFile->unget();
                }
                return false;
            }
        }
        if (peekNextChar() != -1)
            return false;
        return true;
    }
}